

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_pipeline_layout
               (StateRecorder *recorder,VkPipelineLayoutCreateInfo *layout,Hash *out_hash)

{
  bool bVar1;
  VkPushConstantRange *pVVar2;
  Hash HVar3;
  VkPushConstantRange *push;
  uint64_t uStack_40;
  uint32_t i_1;
  Hash hash;
  uint32_t i;
  Hasher h;
  Hash *out_hash_local;
  VkPipelineLayoutCreateInfo *layout_local;
  StateRecorder *recorder_local;
  
  h.h = (Hash)out_hash;
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd0);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd0,layout->setLayoutCount);
  hash._4_4_ = 0;
  do {
    if (layout->setLayoutCount <= hash._4_4_) {
      Hasher::u32((Hasher *)&stack0xffffffffffffffd0,layout->pushConstantRangeCount);
      for (push._4_4_ = 0; push._4_4_ < layout->pushConstantRangeCount; push._4_4_ = push._4_4_ + 1)
      {
        pVVar2 = layout->pPushConstantRanges + push._4_4_;
        Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVVar2->stageFlags);
        Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVVar2->size);
        Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVVar2->offset);
      }
      Hasher::u32((Hasher *)&stack0xffffffffffffffd0,layout->flags);
      HVar3 = Hasher::get((Hasher *)&stack0xffffffffffffffd0);
      *(Hash *)h.h = HVar3;
      return true;
    }
    if (layout->pSetLayouts[hash._4_4_] == (VkDescriptorSetLayout)0x0) {
      Hasher::u32((Hasher *)&stack0xffffffffffffffd0,0);
    }
    else {
      bVar1 = StateRecorder::get_hash_for_descriptor_set_layout
                        (recorder,layout->pSetLayouts[hash._4_4_],&stack0xffffffffffffffc0);
      if (!bVar1) {
        return false;
      }
      Hasher::u64((Hasher *)&stack0xffffffffffffffd0,uStack_40);
    }
    hash._4_4_ = hash._4_4_ + 1;
  } while( true );
}

Assistant:

bool compute_hash_pipeline_layout(const StateRecorder &recorder, const VkPipelineLayoutCreateInfo &layout, Hash *out_hash)
{
	Hasher h;

	h.u32(layout.setLayoutCount);
	for (uint32_t i = 0; i < layout.setLayoutCount; i++)
	{
		if (layout.pSetLayouts[i])
		{
			Hash hash;
			if (!recorder.get_hash_for_descriptor_set_layout(layout.pSetLayouts[i], &hash))
				return false;
			h.u64(hash);
		}
		else
			h.u32(0);
	}

	h.u32(layout.pushConstantRangeCount);
	for (uint32_t i = 0; i < layout.pushConstantRangeCount; i++)
	{
		auto &push = layout.pPushConstantRanges[i];
		h.u32(push.stageFlags);
		h.u32(push.size);
		h.u32(push.offset);
	}

	h.u32(layout.flags);

	*out_hash = h.get();
	return true;
}